

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_last_not_of(StringPiece *this,StringPiece s,size_type pos)

{
  StringPiece characters_wanted;
  unsigned_long *puVar1;
  bool *in_RDX;
  long *in_RDI;
  bool lookup [256];
  stringpiece_ssize_type i;
  size_type in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  char c;
  StringPiece *in_stack_fffffffffffffec8;
  stringpiece_ssize_type in_stack_fffffffffffffed0;
  unsigned_long local_38;
  unsigned_long local_30;
  unsigned_long local_28 [3];
  bool *local_10;
  unsigned_long local_8;
  
  c = (char)((ulong)in_stack_fffffffffffffec0 >> 0x38);
  if (in_RDI[1] < 1) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_38 = in_RDI[1] - 1;
    local_10 = in_RDX;
    puVar1 = std::min<unsigned_long>(local_28,&local_38);
    local_30 = *puVar1;
    local_8 = local_30;
    if (0 < (long)local_10) {
      if (local_10 == (bool *)0x1) {
        local_8 = find_last_not_of(in_stack_fffffffffffffec8,c,in_stack_fffffffffffffeb8);
      }
      else {
        memset(&stack0xfffffffffffffec8,0,0x100);
        characters_wanted.length_ = in_stack_fffffffffffffed0;
        characters_wanted.ptr_ = (char *)in_stack_fffffffffffffec8;
        BuildLookupTable(characters_wanted,local_10);
        for (; -1 < (long)local_30; local_30 = local_30 - 1) {
          if (((&stack0xfffffffffffffec8)[*(byte *)(*in_RDI + local_30)] & 1) == 0) {
            return local_30;
          }
        }
        local_8 = 0xffffffffffffffff;
      }
    }
  }
  return local_8;
}

Assistant:

stringpiece_ssize_type StringPiece::find_last_not_of(StringPiece s,
                                                     size_type pos) const {
  if (length_ <= 0) return npos;

  stringpiece_ssize_type i = std::min(pos, static_cast<size_type>(length_ - 1));
  if (s.length_ <= 0) return i;

  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_not_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (; i >= 0; --i) {
    if (!lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}